

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O0

void __thiscall
axl::rc::
Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>::Hdr>
::clear(Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>::Hdr>
        *this)

{
  RefCount *in_RDI;
  
  if (in_RDI->m_freeFunc != (FreeFunc *)0x0) {
    RefCount::release(in_RDI);
  }
  initialize((Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>::Hdr>
              *)in_RDI);
  return;
}

Assistant:

void
	clear() {
		if (m_refCount)
			m_refCount->release();

		initialize();
	}